

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O3

vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *
validation_layer::createDestroySet(void)

{
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *extraout_RAX;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *extraout_RAX_00;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *extraout_RAX_01;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *extraout_RAX_02;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  long *plVar2;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *in_RDI;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<validation_layer::ctorsAndDtors> __l_21;
  allocator_type local_5c7;
  allocator_type local_5c6;
  allocator_type local_5c5;
  allocator_type local_5c4;
  allocator_type local_5c3;
  allocator_type local_5c2;
  allocator_type local_5c1;
  allocator_type local_5c0;
  allocator_type local_5bf;
  allocator_type local_5be;
  allocator_type local_5bd;
  allocator_type local_5bc;
  allocator_type local_5bb;
  allocator_type local_5ba;
  allocator_type local_5b9;
  allocator_type local_5b8;
  allocator_type local_5b7;
  allocator_type local_5b6;
  allocator_type local_5b5;
  allocator_type local_5b4;
  allocator_type local_5b3;
  allocator_type local_5b2;
  allocator_type local_5b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  long *local_340 [2];
  long local_330 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  long *local_300 [2];
  long local_2f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  long *local_2c0 [2];
  long local_2b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  long *local_260 [2];
  long local_250 [2];
  ctorsAndDtors local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"zeContextCreate","");
  __l._M_len = 1;
  __l._M_array = &local_380;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_240.ctors,__l,&local_5b1);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"zeContextDestroy","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_3a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_240.dtors,__l_00,&local_5b2);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"zeCommandQueueCreate","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_3c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,__l_01,&local_5b3);
  local_3e8._0_8_ = local_3e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"zeCommandQueueDestroy","");
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_3e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,__l_02,&local_5b4);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"zeModuleCreate","");
  __l_03._M_len = 1;
  __l_03._M_array = &local_408;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,__l_03,&local_5b5);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"zeModuleDestroy","");
  __l_04._M_len = 1;
  __l_04._M_array = &local_428;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l_04,&local_5b6);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"zeKernelCreate","");
  __l_05._M_len = 1;
  __l_05._M_array = &local_448;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_05,&local_5b7);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"zeKernelDestroy","");
  __l_06._M_len = 1;
  __l_06._M_array = &local_468;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l_06,&local_5b8);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"zeEventPoolCreate","");
  __l_07._M_len = 1;
  __l_07._M_array = &local_488;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,__l_07,&local_5b9);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"zeEventPoolDestroy","");
  __l_08._M_len = 1;
  __l_08._M_array = &local_4a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_08,&local_5ba);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"zeCommandListCreateImmediate","");
  plVar2 = local_2b0;
  local_2c0[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"zeCommandListCreate","");
  __l_09._M_len = 2;
  __l_09._M_array = &local_2e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l_09,&local_5bb);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"zeCommandListDestroy","");
  __l_10._M_len = 1;
  __l_10._M_array = &local_4c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_10,&local_5bc);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"zeEventCreate","");
  __l_11._M_len = 1;
  __l_11._M_array = &local_4e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120,__l_11,&local_5bd);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"zeEventDestroy","");
  __l_12._M_len = 1;
  __l_12._M_array = &local_508;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l_12,&local_5be);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"zeFenceCreate","");
  __l_13._M_len = 1;
  __l_13._M_array = &local_528;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,__l_13,&local_5bf);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"zeFenceDestroy","");
  __l_14._M_len = 1;
  __l_14._M_array = &local_548;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l_14,&local_5c0);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"zeImageCreate","");
  plVar3 = local_2f0;
  local_300[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"zeImageViewCreateExt","");
  __l_15._M_len = 2;
  __l_15._M_array = &local_320;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_15,&local_5c1);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"zeImageDestroy","");
  __l_16._M_len = 1;
  __l_16._M_array = &local_568;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l_16,&local_5c2);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"zeSamplerCreate","");
  __l_17._M_len = 1;
  __l_17._M_array = &local_588;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l_17,&local_5c3);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"zeSamplerDestroy","");
  __l_18._M_len = 1;
  __l_18._M_array = &local_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,__l_18,&local_5c4);
  local_5b0 = &local_60;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"zeMemAllocDevice","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"zeMemAllocHost","");
  plVar4 = local_250;
  local_260[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"zeMemAllocShared","");
  __l_19._M_len = 3;
  __l_19._M_array = &local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,__l_19,&local_5c5);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"zeMemFree","");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"zeMemFreeExt","");
  __l_20._M_len = 2;
  __l_20._M_array = &local_360;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l_20,&local_5c6);
  __l_21._M_len = 0xb;
  __l_21._M_array = &local_240;
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  vector(in_RDI,__l_21,&local_5c7);
  lVar6 = -0x210;
  this = &local_48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this + -1);
    this = this + -2;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0);
  lVar6 = -0x40;
  plVar5 = local_330;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  lVar6 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  lVar6 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  lVar6 = -0x40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = (vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
            *)(local_3e8 + 0x10);
  if ((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *)
      local_3e8._0_8_ != pvVar1) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    pvVar1 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    pvVar1 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    pvVar1 = extraout_RAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    pvVar1 = extraout_RAX_02;
  }
  return pvVar1;
}

Assistant:

static std::vector<ctorsAndDtors> createDestroySet() {
        return {
            {{"zeContextCreate"}, {"zeContextDestroy"}},
            {{"zeCommandQueueCreate"}, {"zeCommandQueueDestroy"}},
            {{"zeModuleCreate"}, {"zeModuleDestroy"}},
            {{"zeKernelCreate"}, {"zeKernelDestroy"}},
            {{"zeEventPoolCreate"}, {"zeEventPoolDestroy"}},
            {{"zeCommandListCreateImmediate", "zeCommandListCreate"}, {"zeCommandListDestroy"}},
            {{"zeEventCreate"}, {"zeEventDestroy"}},
            {{"zeFenceCreate"}, {"zeFenceDestroy"}},
            {{"zeImageCreate", "zeImageViewCreateExt"}, {"zeImageDestroy"}},
            {{"zeSamplerCreate"}, {"zeSamplerDestroy"}},
            {{"zeMemAllocDevice", "zeMemAllocHost", "zeMemAllocShared"}, {"zeMemFree", "zeMemFreeExt"}}
        };
    }